

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
LinkLanguageAndIdNode::Evaluate
          (string *__return_storage_ptr__,LinkLanguageAndIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer pbVar1;
  size_t sVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  string *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  char *pcVar11;
  char *pcVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  idParameter;
  string genName;
  string local_b0;
  string local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  long *local_58 [2];
  long local_48 [2];
  GeneratorExpressionContent *local_38;
  
  if (((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) ||
      (context->HeadTarget == (cmGeneratorTarget *)0x0)) ||
     ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression(dagChecker), !bVar4 &&
      (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                         (dagChecker,(cmGeneratorTarget *)0x0,ANY), !bVar4)))) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,content);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "$<LINK_LANG_AND_ID:lang,id> may only be used with binary targets to specify link libraries, link directories, link options, and link depends."
               ,"");
    reportError(context,&local_b0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (*context->LG->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_58);
    lVar6 = std::__cxx11::string::find((char *)local_58,0x6d752c,0);
    if ((((lVar6 == -1) &&
         (lVar6 = std::__cxx11::string::find((char *)local_58,0x6aca0b,0), lVar6 == -1)) &&
        (lVar6 = std::__cxx11::string::find((char *)local_58,0x6a8911,0), lVar6 == -1)) &&
       ((lVar6 = std::__cxx11::string::find((char *)local_58,0x6a979b,0), lVar6 == -1 &&
        (lVar6 = std::__cxx11::string::find((char *)local_58,0x6aca24,0), lVar6 == -1)))) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,content);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"$<LINK_LANG_AND_ID:lang,id> not supported for this generator."
                 ,"");
      reportError(context,&local_b0,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagChecker,(cmGeneratorTarget *)0x0,ANY);
      if (bVar4) {
        context->HadHeadSensitiveCondition = true;
        context->HadLinkLanguageSensitiveCondition = true;
      }
      pbVar1 = (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar2 = (context->Language)._M_string_length;
      if ((sVar2 == pbVar1->_M_string_length) &&
         ((sVar2 == 0 ||
          (iVar5 = bcmp((context->Language)._M_dataplus._M_p,(pbVar1->_M_dataplus)._M_p,sVar2),
          iVar5 == 0)))) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_70,
                   pbVar1 + 1,
                   (parameters->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_b0);
        this_00 = context->LG->Makefile;
        std::operator+(&local_90,"CMAKE_",&context->Language);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_b0.field_2._M_allocated_capacity = *psVar10;
          local_b0.field_2._8_8_ = plVar7[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar10;
          local_b0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_b0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        psVar8 = cmMakefile::GetSafeDefinition(this_00,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_70.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_70.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = (psVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar8->_M_string_length);
        }
        else if (psVar8->_M_string_length == 0) {
          bVar4 = (local_70.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0;
          pcVar12 = "0";
          if (bVar4) {
            pcVar12 = "1";
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar11 = "";
          if (bVar4) {
            pcVar11 = "";
          }
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,pcVar12,pcVar11);
        }
        else {
          pbVar1 = local_70.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_38 = content;
          if (((anonymous_namespace)::LinkerId::
               Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
               ::linkerIdValidator == '\0') &&
             (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::LinkerId::
                                           Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                                           ::linkerIdValidator),
             pbVar1 = local_70.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, iVar5 != 0)) {
            (anonymous_namespace)::LinkerId::
            Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
            ::linkerIdValidator._176_8_ = 0;
            (anonymous_namespace)::LinkerId::
            Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
            ::linkerIdValidator._192_8_ = 0;
            (anonymous_namespace)::LinkerId::
            Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
            ::linkerIdValidator._200_4_ = 0;
            memset((anonymous_namespace)::LinkerId::
                   Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                   ::linkerIdValidator,0,0xaa);
            cmsys::RegularExpression::compile
                      ((RegularExpression *)
                       (anonymous_namespace)::LinkerId::
                       Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                       ::linkerIdValidator,"^[A-Za-z0-9_]*$");
            __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                         (anonymous_namespace)::LinkerId::
                         Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                         ::linkerIdValidator,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::LinkerId::
                                 Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                                 ::linkerIdValidator);
            pbVar1 = local_70.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          for (; pbVar1 != local_70.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
            bVar4 = cmsys::RegularExpression::find
                              ((RegularExpression *)
                               (anonymous_namespace)::LinkerId::
                               Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                               ::linkerIdValidator,(pbVar1->_M_dataplus)._M_p,
                               (RegularExpressionMatch *)
                               (anonymous_namespace)::LinkerId::
                               Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                               ::linkerIdValidator);
            if (!bVar4) {
              GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,local_38);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"Expression syntax not recognized.","");
              reportError(context,&local_b0,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              paVar9 = &__return_storage_ptr__->field_2;
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar9;
              __return_storage_ptr__->_M_string_length = 0;
              goto LAB_004de9ef;
            }
            sVar2 = pbVar1->_M_string_length;
            if ((sVar2 == psVar8->_M_string_length) &&
               ((sVar2 == 0 ||
                (iVar5 = bcmp((pbVar1->_M_dataplus)._M_p,(psVar8->_M_dataplus)._M_p,sVar2),
                iVar5 == 0)))) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '1';
              goto LAB_004de9e3;
            }
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '0';
LAB_004de9e3:
          __return_storage_ptr__->_M_string_length = 1;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((__return_storage_ptr__->field_2)._M_local_buf + 1);
LAB_004de9ef:
          paVar9->_M_local_buf[0] = '\0';
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_70);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
      }
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    if (!context->HeadTarget || !dagChecker ||
        !(dagChecker->EvaluatingLinkExpression() ||
          dagChecker->EvaluatingLinkLibraries())) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<LINK_LANG_AND_ID:lang,id> may only be used with binary targets "
        "to specify link libraries, link directories, link options, and link "
        "depends.");
      return std::string();
    }

    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    std::string genName = gg->GetName();
    if (genName.find("Makefiles") == std::string::npos &&
        genName.find("Ninja") == std::string::npos &&
        genName.find("Visual Studio") == std::string::npos &&
        genName.find("Xcode") == std::string::npos &&
        genName.find("Watcom WMake") == std::string::npos) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<LINK_LANG_AND_ID:lang,id> not supported for this generator.");
      return std::string();
    }

    if (dagChecker->EvaluatingLinkLibraries()) {
      context->HadHeadSensitiveCondition = true;
      context->HadLinkLanguageSensitiveCondition = true;
    }

    const std::string& lang = context->Language;
    if (lang == parameters.front()) {
      std::vector<std::string> idParameter((parameters.cbegin() + 1),
                                           parameters.cend());
      return LinkerId::Evaluate(idParameter, context, content, lang);
    }
    return "0";
  }